

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

bool __thiscall
arealights::Application::onMouseButton(Application *this,int button,int action,int mods)

{
  bool bVar1;
  
  bVar1 = fw::ImGuiApplication::onMouseButton(&this->super_ImGuiApplication,button,action,mods);
  if (!bVar1) {
    if (action == 0) {
      fw::GenericMouseInput::buttonUp
                ((this->_mouseInput).
                 super___shared_ptr<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr,button
                );
    }
    else if (action == 1) {
      fw::GenericMouseInput::buttonDown
                ((this->_mouseInput).
                 super___shared_ptr<fw::GenericMouseInput,_(__gnu_cxx::_Lock_policy)2>._M_ptr,button
                );
    }
  }
  return true;
}

Assistant:

bool Application::onMouseButton(int button, int action, int mods)
{
    if (ImGuiApplication::onMouseButton(button, action, mods)) { return true; }

    if (action == GLFW_PRESS)
    {
        _mouseInput->buttonDown(button);
    }
    else if (action == GLFW_RELEASE)
    {
        _mouseInput->buttonUp(button);
    }

    return true;
}